

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

reverse_iterator * __thiscall llvm::sys::path::reverse_iterator::operator++(reverse_iterator *this)

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  Style in_ECX;
  ulong uVar5;
  ulong uVar6;
  StringRef str;
  StringRef str_00;
  
  str.Length._0_4_ = this->S;
  str.Data = (char *)(this->Path).Length;
  str.Length._4_4_ = 0;
  sVar3 = anon_unknown.dwarf_44276fd::root_dir_start
                    ((anon_unknown_dwarf_44276fd *)(this->Path).Data,str,in_ECX);
  uVar2 = this->Position;
  uVar6 = uVar2;
  if (uVar2 != 0) {
    uVar5 = uVar2;
    do {
      uVar6 = sVar3 + 1;
      if (sVar3 + 1 == uVar5) goto LAB_00db22f8;
      if ((this->Path).Length <= uVar2 - 1) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                      ,0xf9,"char llvm::StringRef::operator[](size_t) const");
      }
      cVar1 = (this->Path).Data[uVar5 - 1];
      if ((cVar1 != '/') && (uVar6 = uVar5, cVar1 != '\\' || this->S != windows)) goto LAB_00db22f8;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar6 = 0;
  }
LAB_00db22f8:
  uVar5 = (this->Path).Length;
  if ((uVar5 == 0 || uVar2 != uVar5) ||
     (((cVar1 = (this->Path).Data[uVar5 - 1], cVar1 != '/' &&
       ((cVar1 != '\\' || (this->S != windows)))) ||
      (sVar3 != 0xffffffffffffffff && uVar6 - 1 <= sVar3)))) {
    if (uVar6 <= uVar5) {
      uVar5 = uVar6;
    }
    str_00.Length._0_4_ = this->S;
    str_00.Data = (char *)uVar5;
    str_00.Length._4_4_ = 0;
    sVar4 = anon_unknown.dwarf_44276fd::filename_pos
                      ((anon_unknown_dwarf_44276fd *)(this->Path).Data,str_00,(Style)uVar2);
    uVar2 = (this->Path).Length;
    sVar3 = sVar4;
    if (uVar2 < sVar4) {
      sVar3 = uVar2;
    }
    uVar5 = uVar6;
    if (uVar6 < sVar3) {
      uVar5 = sVar3;
    }
    if (uVar2 < uVar6) {
      uVar5 = uVar2;
    }
    (this->Component).Data = (this->Path).Data + sVar3;
    (this->Component).Length = uVar5 - sVar3;
    this->Position = sVar4;
  }
  else {
    this->Position = uVar2 - 1;
    (this->Component).Data = ".";
    (this->Component).Length = 1;
  }
  return this;
}

Assistant:

reverse_iterator &reverse_iterator::operator++() {
  size_t root_dir_pos = root_dir_start(Path, S);

  // Skip separators unless it's the root directory.
  size_t end_pos = Position;
  while (end_pos > 0 && (end_pos - 1) != root_dir_pos &&
         is_separator(Path[end_pos - 1], S))
    --end_pos;

  // Treat trailing '/' as a '.', unless it is the root dir.
  if (Position == Path.size() && !Path.empty() &&
      is_separator(Path.back(), S) &&
      (root_dir_pos == StringRef::npos || end_pos - 1 > root_dir_pos)) {
    --Position;
    Component = ".";
    return *this;
  }

  // Find next separator.
  size_t start_pos = filename_pos(Path.substr(0, end_pos), S);
  Component = Path.slice(start_pos, end_pos);
  Position = start_pos;
  return *this;
}